

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O1

int yaml_emitter_dump_node(yaml_emitter_t *emitter,int index)

{
  yaml_node_type_t yVar1;
  yaml_node_t *pyVar2;
  yaml_tag_directive_t *__s1;
  uint uVar3;
  yaml_char_t *__s;
  int iVar4;
  int *piVar5;
  yaml_event_t local_98;
  
  pyVar2 = (emitter->document->nodes).start;
  iVar4 = index + -1;
  uVar3 = emitter->anchors[iVar4].anchor;
  if (uVar3 == 0) {
    __s = (yaml_char_t *)0x0;
  }
  else {
    __s = (yaml_char_t *)yaml_malloc(0x10);
    if (__s == (yaml_char_t *)0x0) {
      __s = (yaml_char_t *)0x0;
    }
    else {
      sprintf((char *)__s,"id%03d",(ulong)uVar3);
    }
    if (__s == (yaml_char_t *)0x0) {
      return 0;
    }
  }
  local_98.data.document_start.version_directive = (yaml_version_directive_t *)__s;
  if (emitter->anchors[iVar4].serialized == 0) {
    emitter->anchors[iVar4].serialized = 1;
    yVar1 = pyVar2[(long)index + -1].type;
    if (yVar1 == YAML_MAPPING_NODE) {
      iVar4 = strcmp((char *)pyVar2[(long)index + -1].tag,"tag:yaml.org,2002:map");
      local_98.data._40_8_ = 0;
      local_98.data.scalar.length = 0;
      local_98.data._32_8_ = 0;
      local_98.type = YAML_MAPPING_START_EVENT;
      local_98._4_4_ = 0;
      local_98.start_mark.column = 0;
      local_98.end_mark.index = 0;
      local_98.end_mark.line = 0;
      local_98.end_mark.column = 0;
      local_98.start_mark.index = 0;
      local_98.start_mark.line = 0;
      local_98.data.document_start.tag_directives.start =
           (yaml_tag_directive_t *)pyVar2[(long)index + -1].tag;
      local_98.data.sequence_start.implicit._1_3_ = 0;
      local_98.data.sequence_start.implicit._0_1_ = iVar4 == 0;
      local_98.data.sequence_start.style = pyVar2[(long)index + -1].data.sequence.style;
      iVar4 = yaml_emitter_emit(emitter,&local_98);
      if (iVar4 == 0) {
        return 0;
      }
      for (piVar5 = pyVar2[(long)index + -1].data.sequence.items.start;
          piVar5 < pyVar2[(long)index + -1].data.sequence.items.top; piVar5 = piVar5 + 2) {
        iVar4 = yaml_emitter_dump_node(emitter,*piVar5);
        if (iVar4 == 0) {
          return 0;
        }
        iVar4 = yaml_emitter_dump_node(emitter,piVar5[1]);
        if (iVar4 == 0) {
          return 0;
        }
      }
      local_98.type = YAML_MAPPING_END_EVENT;
      local_98._4_4_ = 0;
    }
    else {
      if (yVar1 != YAML_SEQUENCE_NODE) {
        if (yVar1 != YAML_SCALAR_NODE) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                        ,0x121,"int yaml_emitter_dump_node(yaml_emitter_t *, int)");
        }
        __s1 = (yaml_tag_directive_t *)pyVar2[(long)index + -1].tag;
        iVar4 = strcmp((char *)__s1,"tag:yaml.org,2002:str");
        local_98.type = YAML_SCALAR_EVENT;
        local_98._4_4_ = 0;
        local_98.data.document_start.tag_directives.end =
             (yaml_tag_directive_t *)pyVar2[(long)index + -1].data.scalar.value;
        local_98.data.scalar.length = pyVar2[(long)index + -1].data.scalar.length;
        local_98.data.scalar.plain_implicit._1_3_ = 0;
        local_98.data.scalar.plain_implicit._0_1_ = iVar4 == 0;
        local_98.data.scalar.quoted_implicit._0_1_ = iVar4 == 0;
        local_98.data.scalar.quoted_implicit._1_3_ = 0;
        local_98.data._44_4_ = 0;
        local_98.data.scalar.style = pyVar2[(long)index + -1].data.scalar.style;
        local_98.data._8_8_ = __s1;
        goto LAB_00105662;
      }
      iVar4 = strcmp((char *)pyVar2[(long)index + -1].tag,"tag:yaml.org,2002:seq");
      local_98.data._40_8_ = 0;
      local_98.data.scalar.length = 0;
      local_98.data._32_8_ = 0;
      local_98.type = YAML_SEQUENCE_START_EVENT;
      local_98._4_4_ = 0;
      local_98.start_mark.column = 0;
      local_98.end_mark.index = 0;
      local_98.end_mark.line = 0;
      local_98.end_mark.column = 0;
      local_98.start_mark.index = 0;
      local_98.start_mark.line = 0;
      local_98.data.document_start.tag_directives.start =
           (yaml_tag_directive_t *)pyVar2[(long)index + -1].tag;
      local_98.data.sequence_start.implicit._1_3_ = 0;
      local_98.data.sequence_start.implicit._0_1_ = iVar4 == 0;
      local_98.data.sequence_start.style = pyVar2[(long)index + -1].data.sequence.style;
      iVar4 = yaml_emitter_emit(emitter,&local_98);
      if (iVar4 == 0) {
        return 0;
      }
      for (piVar5 = pyVar2[(long)index + -1].data.sequence.items.start;
          piVar5 < pyVar2[(long)index + -1].data.sequence.items.top; piVar5 = piVar5 + 1) {
        iVar4 = yaml_emitter_dump_node(emitter,*piVar5);
        if (iVar4 == 0) {
          return 0;
        }
      }
      local_98.type = YAML_SEQUENCE_END_EVENT;
      local_98._4_4_ = 0;
    }
    local_98.data._40_8_ = 0;
    local_98.data._32_8_ = 0;
    local_98.data.scalar.length = 0;
    local_98.data.document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    local_98.data.document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    local_98.data.document_start.version_directive = (yaml_version_directive_t *)0x0;
    local_98.end_mark.line = 0;
    local_98.end_mark.column = 0;
    local_98.start_mark.column = 0;
    local_98.end_mark.index = 0;
    local_98.start_mark.index = 0;
    local_98.start_mark.line = 0;
    iVar4 = yaml_emitter_emit(emitter,&local_98);
    uVar3 = (uint)(iVar4 != 0);
  }
  else {
    local_98.data._40_8_ = 0;
    local_98.data.scalar.length = 0;
    local_98.data._32_8_ = 0;
    local_98.data.document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    local_98.data.document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    local_98.type = YAML_ALIAS_EVENT;
    local_98._4_4_ = 0;
LAB_00105662:
    local_98.end_mark.column = 0;
    local_98.end_mark.line = 0;
    local_98.end_mark.index = 0;
    local_98.start_mark.column = 0;
    local_98.start_mark.line = 0;
    local_98.start_mark.index = 0;
    uVar3 = yaml_emitter_emit(emitter,&local_98);
  }
  return uVar3;
}

Assistant:

static int
yaml_emitter_dump_node(yaml_emitter_t *emitter, int index)
{
    yaml_node_t *node = emitter->document->nodes.start + index - 1;
    int anchor_id = emitter->anchors[index-1].anchor;
    yaml_char_t *anchor = NULL;

    if (anchor_id) {
        anchor = yaml_emitter_generate_anchor(emitter, anchor_id);
        if (!anchor) return 0;
    }

    if (emitter->anchors[index-1].serialized) {
        return yaml_emitter_dump_alias(emitter, anchor);
    }

    emitter->anchors[index-1].serialized = 1;

    switch (node->type) {
        case YAML_SCALAR_NODE:
            return yaml_emitter_dump_scalar(emitter, node, anchor);
        case YAML_SEQUENCE_NODE:
            return yaml_emitter_dump_sequence(emitter, node, anchor);
        case YAML_MAPPING_NODE:
            return yaml_emitter_dump_mapping(emitter, node, anchor);
        default:
            assert(0);      /* Could not happen. */
            break;
    }

    return 0;       /* Could not happen. */
}